

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_.cpp
# Opt level: O2

void __thiscall vector_<char>::insert(vector_<char> *this,int index,char *value)

{
  char *pcVar1;
  invalid_argument *this_00;
  ulong uVar2;
  ulong uVar3;
  
  if (this->capacity < this->_size + 1) {
    resize(this);
  }
  if ((-1 < index) && (uVar2 = this->_size, (uint)index <= uVar2)) {
    while (index < (int)uVar2) {
      uVar3 = uVar2 & 0xffffffff;
      uVar2 = (ulong)((int)uVar2 - 1);
      pcVar1 = (this->arr)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl;
      pcVar1[uVar3] = pcVar1[uVar2];
    }
    (this->arr)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl[(uint)index] = *value;
    this->_size = this->_size + 1;
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Index out of range error");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void insert(const int index, const T &value) {
        if (_size + 1 > capacity) {
            resize();
        }
        if (index < 0 || index > _size) {
            throw invalid_argument("Index out of range error");
        }
        for (int i = _size; i > index; i--) {
            arr[i] = arr[i - 1];
        }
        arr[index] = value;
        ++_size;
    }